

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O3

void __thiscall
slang::ast::PatternCaseStatement::visitStmts<hgdb::rtl::Serializer&>
          (PatternCaseStatement *this,Serializer *visitor)

{
  size_type sVar1;
  pointer pIVar2;
  Statement *this_00;
  long lVar3;
  
  sVar1 = (this->items).size_;
  if (sVar1 != 0) {
    pIVar2 = (this->items).data_;
    lVar3 = 0;
    do {
      this_00 = *(Statement **)((long)&(pIVar2->stmt).ptr + lVar3);
      if (this_00 == (Statement *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Statement *>::get() const [T = const slang::ast::Statement *]"
                  );
      }
      Statement::visit<hgdb::rtl::Serializer&>(this_00,visitor);
      lVar3 = lVar3 + 0x18;
    } while (sVar1 * 0x18 != lVar3);
  }
  if (this->defaultCase != (Statement *)0x0) {
    Statement::visit<hgdb::rtl::Serializer&>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }